

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ResourceTag RVar1;
  FILE *pFVar2;
  pointer puVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  DatabaseInterface *pDVar9;
  undefined8 uVar10;
  pointer pDVar11;
  unsigned_long *puVar12;
  reference puVar13;
  uchar *buffer;
  size_type size;
  size_type sVar14;
  type pDVar15;
  type pDVar16;
  ResourceTag tag_1;
  ResourceTag *__end1_1;
  ResourceTag *__begin1_1;
  ResourceTag (*__range1_1) [9];
  unsigned_long *h;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unreferenced_modules;
  undefined1 local_f88 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes_1;
  size_t hash_count_1;
  size_t compressed_size;
  size_t state_json_size;
  unsigned_long hash_1;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint64_t ts;
  unsigned_long hash;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  Hash latest_hash;
  uint64_t latest_ts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> accepted_hashes;
  undefined1 local_ee0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  size_t hash_count;
  ResourceTag *tag;
  ResourceTag *__end1;
  ResourceTag *__begin1;
  ResourceTag (*__range1) [9];
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  uint per_tag_written [10];
  uint local_e58 [2];
  uint per_tag_read [10];
  undefined1 local_e28 [8];
  PruneReplayer prune_replayer;
  StateReplayer replayer;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  output_db;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  input_db;
  CLICallbacks local_6d0;
  undefined1 local_658 [8];
  CLIParser parser;
  anon_class_8_1_650cafbd local_5c0;
  function<void_(Fossilize::CLIParser_&)> local_5b8;
  anon_class_8_1_b304c6e7 local_598;
  function<void_(Fossilize::CLIParser_&)> local_590;
  anon_class_8_1_6a288fbd local_570;
  function<void_(Fossilize::CLIParser_&)> local_568;
  anon_class_8_1_508fbe57 local_548;
  function<void_(Fossilize::CLIParser_&)> local_540;
  anon_class_8_1_6f80b1a4 local_520;
  function<void_(Fossilize::CLIParser_&)> local_518;
  anon_class_8_1_b574c2b9 local_4f8;
  function<void_(Fossilize::CLIParser_&)> local_4f0;
  anon_class_8_1_5eff1254 local_4d0;
  function<void_(Fossilize::CLIParser_&)> local_4c8;
  anon_class_8_1_aa9a606c local_4a8;
  function<void_(Fossilize::CLIParser_&)> local_4a0;
  anon_class_16_2_56c46ee9 local_480;
  function<void_(Fossilize::CLIParser_&)> local_470;
  anon_class_8_1_f4c703fe local_450;
  function<void_(Fossilize::CLIParser_&)> local_448;
  anon_class_8_1_07de1a1f local_428;
  function<void_(Fossilize::CLIParser_&)> local_420;
  anon_class_8_1_e44564ae local_400;
  function<void_(Fossilize::CLIParser_&)> local_3f8;
  anon_class_8_1_ce1e5952 local_3d8;
  function<void_(Fossilize::CLIParser_&)> local_3d0;
  anon_class_16_2_ab7b7754 local_3b0;
  function<void_(Fossilize::CLIParser_&)> local_3a0;
  anon_class_8_1_7841c046 local_380;
  function<void_(Fossilize::CLIParser_&)> local_378;
  anon_class_8_1_eedc21f1 local_358;
  function<void_(Fossilize::CLIParser_&)> local_350;
  anon_class_1_0_00000001 local_329;
  function<void_(Fossilize::CLIParser_&)> local_328;
  undefined1 local_308 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  banned_graphics;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  bool invert_module_pruning;
  bool skip_application_info_links;
  Hash HStack_140;
  bool should_filter_application_hash;
  Hash application_hash;
  undefined1 local_130 [4];
  uint timestamp_seconds;
  string timestamp;
  string blacklist;
  string whitelist;
  string output_db_path;
  string input_db_path;
  CLICallbacks cbs;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  cbs.default_handler._M_invoker = (_Invoker_type)argv;
  Fossilize::CLICallbacks::CLICallbacks((CLICallbacks *)((long)&input_db_path.field_2 + 8));
  std::__cxx11::string::string((string *)(output_db_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(whitelist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(blacklist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(timestamp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_130);
  application_hash._4_4_ = 0;
  HStack_140 = 0;
  filter_graphics._M_h._M_single_bucket._7_1_ = 0;
  filter_graphics._M_h._M_single_bucket._6_1_ = 0;
  filter_graphics._M_h._M_single_bucket._5_1_ = 0;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_compute._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_raytracing._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_modules._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&banned_graphics._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&banned_compute._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&banned_raytracing._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&banned_modules._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_308);
  std::function<void(Fossilize::CLIParser&)>::function<main::__0,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_328,&local_329);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--help",&local_328);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_328);
  local_358.input_db_path = (string *)((long)&output_db_path.field_2 + 8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__1,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_350,&local_358);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--input-db",&local_350);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_350);
  local_380.output_db_path = (string *)((long)&whitelist.field_2 + 8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__2,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_378,&local_380);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--output-db",&local_378);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_378);
  local_3b0.application_hash = &stack0xfffffffffffffec0;
  local_3b0.should_filter_application_hash =
       (bool *)((long)&filter_graphics._M_h._M_single_bucket + 7);
  std::function<void(Fossilize::CLIParser&)>::function<main::__3,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_3a0,&local_3b0);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--filter-application",&local_3a0);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_3a0);
  local_3d8.filter_graphics =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&filter_compute._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__4,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_3d0,&local_3d8);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--filter-graphics",&local_3d0);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_3d0);
  local_400.filter_compute =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&filter_raytracing._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__5,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_3f8,&local_400);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--filter-compute",&local_3f8);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_3f8);
  local_428.filter_raytracing =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&filter_modules._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__6,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_420,&local_428);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--filter-raytracing",&local_420);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_420);
  local_450.filter_modules =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&banned_graphics._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__7,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_448,&local_450);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--filter-module",&local_448);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_448);
  local_480.timestamp = (string *)local_130;
  local_480.timestamp_seconds = (uint *)((long)&application_hash + 4);
  std::function<void(Fossilize::CLIParser&)>::function<main::__8,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_470,&local_480);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--filter-timestamp",&local_470);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_470);
  local_4a8.banned_graphics =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&banned_compute._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__9,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_4a0,&local_4a8);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--skip-graphics",&local_4a0);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_4a0);
  local_4d0.banned_compute =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&banned_raytracing._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__10,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_4c8,&local_4d0);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--skip-compute",&local_4c8);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_4c8);
  local_4f8.banned_raytracing =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&banned_modules._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__11,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_4f0,&local_4f8);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--skip-raytracing",&local_4f0);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_4f0);
  local_520.banned_modules =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)local_308;
  std::function<void(Fossilize::CLIParser&)>::function<main::__12,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_518,&local_520);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--skip-module",&local_518);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_518);
  local_548.skip_application_info_links = (bool *)((long)&filter_graphics._M_h._M_single_bucket + 6)
  ;
  std::function<void(Fossilize::CLIParser&)>::function<main::__13,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_540,&local_548);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--skip-application-info-links",
             &local_540);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_540);
  local_570.invert_module_pruning = (bool *)((long)&filter_graphics._M_h._M_single_bucket + 5);
  std::function<void(Fossilize::CLIParser&)>::function<main::__14,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_568,&local_570);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--invert-module-pruning",&local_568
            );
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_568);
  local_598.whitelist = (string *)((long)&blacklist.field_2 + 8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__15,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_590,&local_598);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--whitelist",&local_590);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_590);
  local_5c0.blacklist = (string *)((long)&timestamp.field_2 + 8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__16,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_5b8,&local_5c0);
  Fossilize::CLICallbacks::add
            ((CLICallbacks *)((long)&input_db_path.field_2 + 8),"--blacklist",&local_5b8);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_5b8);
  std::function<void()>::operator=
            ((function<void()> *)&cbs.callbacks._M_h._M_single_bucket,
             (anon_class_1_0_00000001 *)&parser.field_0x8f);
  Fossilize::CLICallbacks::CLICallbacks
            (&local_6d0,(CLICallbacks *)((long)&input_db_path.field_2 + 8));
  Fossilize::CLIParser::CLIParser
            ((CLIParser *)local_658,&local_6d0,argc + -1,
             (char **)(cbs.default_handler._M_invoker + 8));
  Fossilize::CLICallbacks::~CLICallbacks(&local_6d0);
  bVar5 = Fossilize::CLIParser::parse((CLIParser *)local_658);
  if (!bVar5) {
    argv_local._4_4_ = 1;
    goto LAB_001074e0;
  }
  bVar5 = Fossilize::CLIParser::is_ended_state((CLIParser *)local_658);
  if (bVar5) {
    argv_local._4_4_ = 0;
    goto LAB_001074e0;
  }
  uVar7 = std::__cxx11::string::empty();
  if (((uVar7 & 1) != 0) || (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) {
    print_help();
    argv_local._4_4_ = 1;
    goto LAB_001074e0;
  }
  pcVar8 = (char *)std::__cxx11::string::c_str();
  pDVar9 = Fossilize::create_database(pcVar8,ReadOnly);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&output_db,pDVar9);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  pDVar9 = Fossilize::create_database(pcVar8,OverWrite);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&replayer,pDVar9);
  bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&output_db);
  if ((bVar5) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
    pDVar11 = std::
              unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ::operator->(&output_db);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar5 = Fossilize::DatabaseInterface::load_whitelist_database(pDVar11,pcVar8);
    pFVar2 = _stderr;
    if (bVar5) goto LAB_00106196;
    uVar10 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"Fossilize ERROR: Failed to install whitelist database %s.\n",uVar10);
    argv_local._4_4_ = 1;
  }
  else {
LAB_00106196:
    bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&output_db);
    if ((bVar5) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) {
      pDVar11 = std::
                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ::operator->(&output_db);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      bVar5 = Fossilize::DatabaseInterface::load_blacklist_database(pDVar11,pcVar8);
      pFVar2 = _stderr;
      if (!bVar5) {
        uVar10 = std::__cxx11::string::c_str();
        fprintf(pFVar2,"Fossilize ERROR: Failed to install blacklist database %s.\n",uVar10);
        argv_local._4_4_ = 1;
        goto LAB_001074c8;
      }
    }
    bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&output_db);
    if (bVar5) {
      pDVar11 = std::
                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ::operator->(&output_db);
      uVar6 = (*pDVar11->_vptr_DatabaseInterface[2])();
      if ((uVar6 & 1) != 0) {
        bVar5 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&replayer);
        if (bVar5) {
          pDVar11 = std::
                    unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                    ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  *)&replayer);
          uVar6 = (*pDVar11->_vptr_DatabaseInterface[2])();
          if ((uVar6 & 1) != 0) {
            Fossilize::StateReplayer::StateReplayer
                      ((StateReplayer *)&prune_replayer.has_application_info_for_blob);
            PruneReplayer::PruneReplayer((PruneReplayer *)local_e28);
            Fossilize::StateReplayer::set_resolve_shader_module_handles
                      ((StateReplayer *)&prune_replayer.has_application_info_for_blob,false);
            if ((filter_graphics._M_h._M_single_bucket._7_1_ & 1) != 0) {
              prune_replayer.filter_application_hash._0_1_ = 1;
              prune_replayer.timestamp_minimum_accept = HStack_140;
            }
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_raytracing_pipelines._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&filter_compute._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.filter_graphics._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&filter_raytracing._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.filter_compute._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&filter_modules._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.filter_raytracing._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&banned_graphics._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.filter_modules._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&banned_compute._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.banned_graphics._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&banned_raytracing._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.banned_compute._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&banned_modules._M_h._M_single_bucket);
            std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.banned_raytracing._M_h._M_single_bucket,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)local_308);
            prune_replayer.application_info_blob._2_1_ =
                 filter_graphics._M_h._M_single_bucket._6_1_ & 1;
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              pcVar8 = (char *)std::__cxx11::string::c_str();
              pDVar9 = Fossilize::create_stream_archive_database(pcVar8,ReadOnly);
              std::
              unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
              ::reset((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                       *)&prune_replayer.filtered_blob_hashes[9]._M_h._M_single_bucket,pDVar9);
              pDVar11 = std::
                        unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                        ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                      *)&prune_replayer.filtered_blob_hashes[9]._M_h.
                                         _M_single_bucket);
              uVar6 = (*pDVar11->_vptr_DatabaseInterface[2])();
              if ((uVar6 & 1) != 0) {
                prune_replayer.timestamp_db._M_t.
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                     (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
                      )time((time_t *)0x0);
                per_tag_read._32_8_ = ZEXT48(application_hash._4_4_);
                puVar12 = std::min<unsigned_long>
                                    ((unsigned_long *)&prune_replayer.timestamp_db,
                                     (unsigned_long *)(per_tag_read + 8));
                prune_replayer.timestamp_db._M_t.
                super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                ._M_t.
                super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
                     (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
                      )((long)prune_replayer.timestamp_db._M_t.
                              super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
                              .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>.
                              _M_head_impl - *puVar12);
                goto LAB_00106507;
              }
              fprintf(_stderr,"Fossilize ERROR: Failed to open timestamp DB.\n");
              argv_local._4_4_ = 1;
            }
            else {
LAB_00106507:
              memset(local_e58,0,0x28);
              memset(&state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x28);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
              for (__end1 = main::playback_order; __end1 != (ResourceTag *)&std::piecewise_construct
                  ; __end1 = __end1 + 1) {
                hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pDVar11 = std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator->(&output_db);
                uVar6 = (*pDVar11->_vptr_DatabaseInterface[6])
                                  (pDVar11,(ulong)*__end1,
                                   &hashes.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                puVar3 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                if ((uVar6 & 1) == 0) {
                  fprintf(_stderr,"Fossilize ERROR: Failed to get hashes.\n");
                  argv_local._4_4_ = 1;
                  goto LAB_001074a4;
                }
                per_tag_read[(ulong)*__end1 - 2] =
                     (uint)hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (*__end1 != RESOURCE_SHADER_MODULE) {
                  std::allocator<unsigned_long>::allocator
                            ((allocator<unsigned_long> *)
                             ((long)&accepted_hashes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ee0,
                             (size_type)puVar3,
                             (allocator_type *)
                             ((long)&accepted_hashes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  std::allocator<unsigned_long>::~allocator
                            ((allocator<unsigned_long> *)
                             ((long)&accepted_hashes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                  pDVar11 = std::
                            unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                            ::operator->(&output_db);
                  RVar1 = *__end1;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ee0);
                  uVar6 = (*pDVar11->_vptr_DatabaseInterface[6])
                                    (pDVar11,(ulong)RVar1,
                                     &hashes.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if ((uVar6 & 1) == 0) {
                    fprintf(_stderr,"Fossilize ERROR: Failed to get shader module hashes.\n");
                    argv_local._4_4_ = 1;
                    bVar5 = true;
                  }
                  else {
                    if ((*__end1 == RESOURCE_APPLICATION_INFO) &&
                       (bVar5 = std::unique_ptr::operator_cast_to_bool
                                          ((unique_ptr *)
                                           &prune_replayer.filtered_blob_hashes[9]._M_h.
                                            _M_single_bucket), bVar5)) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&latest_ts
                                );
                      latest_hash = 0;
                      __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
                      __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_ee0);
                      hash = (unsigned_long)
                             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                        local_ee0);
                      while (bVar5 = __gnu_cxx::operator!=
                                               (&__end3,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  *)&hash), bVar5) {
                        puVar13 = __gnu_cxx::
                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  ::operator*(&__end3);
                        ts = *puVar13;
                        __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
                        if ((ts == HStack_140) ||
                           (bVar5 = PruneReplayer::filter_timestamp
                                              ((PruneReplayer *)local_e28,RESOURCE_APPLICATION_INFO,
                                               ts,(uint64_t *)&__range2), bVar5)) {
                          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &latest_ts,&ts);
                        }
                        if (latest_hash < __range2) {
                          __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)ts;
                          latest_hash = (Hash)__range2;
                        }
                        __gnu_cxx::
                        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ::operator++(&__end3);
                      }
                      bVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         &latest_ts);
                      if (bVar5) {
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &latest_ts,(value_type *)&__range3);
                      }
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ee0,
                                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&latest_ts
                                );
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&latest_ts
                                );
                    }
                    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                        local_ee0);
                    hash_1 = (unsigned_long)
                             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                        local_ee0);
                    while (bVar5 = __gnu_cxx::operator!=
                                             (&__end2,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  *)&hash_1), bVar5) {
                      puVar13 = __gnu_cxx::
                                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                ::operator*(&__end2);
                      state_json_size = *puVar13;
                      pDVar11 = std::
                                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ::operator->(&output_db);
                      uVar6 = (*pDVar11->_vptr_DatabaseInterface[3])
                                        (pDVar11,(ulong)*__end1,state_json_size,&compressed_size,0,0
                                        );
                      if ((uVar6 & 1) == 0) {
                        fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
                        argv_local._4_4_ = 1;
                        bVar5 = true;
                        goto LAB_00106c74;
                      }
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,
                                 compressed_size);
                      pDVar11 = std::
                                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ::operator->(&output_db);
                      sVar4 = state_json_size;
                      RVar1 = *__end1;
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1)
                      ;
                      uVar6 = (*pDVar11->_vptr_DatabaseInterface[3])(pDVar11,(ulong)RVar1,sVar4);
                      if ((uVar6 & 1) == 0) {
                        fprintf(_stderr,"Fossilize ERROR: Failed to load blob from cache.\n");
                        argv_local._4_4_ = 1;
                        bVar5 = true;
                        goto LAB_00106c74;
                      }
                      prune_replayer.application_info_blob._0_1_ = 0;
                      prune_replayer.application_info_blob._1_1_ = 0;
                      pDVar11 = std::
                                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ::get(&output_db);
                      buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &__range1);
                      size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &__range1);
                      bVar5 = Fossilize::StateReplayer::parse
                                        ((StateReplayer *)
                                         &prune_replayer.has_application_info_for_blob,
                                         (StateCreatorInterface *)local_e28,pDVar11,buffer,size);
                      if (!bVar5) {
                        fprintf(_stderr,
                                "Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%lx).\n",
                                (ulong)*__end1);
                      }
                      if ((*__end1 == RESOURCE_APPLICATION_INFO) &&
                         (((filter_graphics._M_h._M_single_bucket._7_1_ & 1) == 0 ||
                          (state_json_size == HStack_140)))) {
                        pDVar11 = std::
                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  ::operator->(&output_db);
                        uVar6 = (*pDVar11->_vptr_DatabaseInterface[3])
                                          (pDVar11,(ulong)*__end1,state_json_size);
                        if ((uVar6 & 1) == 0) {
                          argv_local._4_4_ = 1;
                          bVar5 = true;
                          goto LAB_00106c74;
                        }
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &__range1,0);
                        pDVar11 = std::
                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  ::operator->(&output_db);
                        sVar4 = state_json_size;
                        RVar1 = *__end1;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &__range1);
                        uVar6 = (*pDVar11->_vptr_DatabaseInterface[3])(pDVar11,(ulong)RVar1,sVar4);
                        if ((uVar6 & 1) == 0) {
                          argv_local._4_4_ = 1;
                          bVar5 = true;
                          goto LAB_00106c74;
                        }
                        pDVar11 = std::
                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                                *)&replayer);
                        sVar4 = state_json_size;
                        RVar1 = *__end1;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &__range1);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &__range1);
                        uVar6 = (*pDVar11->_vptr_DatabaseInterface[4])(pDVar11,(ulong)RVar1,sVar4);
                        if ((uVar6 & 1) == 0) {
                          argv_local._4_4_ = 1;
                          bVar5 = true;
                          goto LAB_00106c74;
                        }
                        per_tag_written[(ulong)*__end1 - 2] =
                             per_tag_written[(ulong)*__end1 - 2] + 1;
                      }
                      __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++(&__end2);
                    }
                    if (*__end1 == RESOURCE_GRAPHICS_PIPELINE) {
                      PruneReplayer::access_graphics_pipelines((PruneReplayer *)local_e28);
                    }
                    else if (*__end1 == RESOURCE_RAYTRACING_PIPELINE) {
                      PruneReplayer::access_raytracing_pipelines((PruneReplayer *)local_e28);
                    }
                    bVar5 = false;
                  }
LAB_00106c74:
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ee0);
                  if (bVar5) goto LAB_001074a4;
                }
              }
              if ((filter_graphics._M_h._M_single_bucket._5_1_ & 1) == 0) {
LAB_00106f63:
                pDVar15 = std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator*(&output_db);
                pDVar16 = std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                       *)&replayer);
                bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&__range1,
                                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                             *)&prune_replayer.filtered_blob_hashes[7]._M_h.
                                                _M_single_bucket,RESOURCE_APPLICATION_BLOB_LINK,
                                            (uint *)&state_json.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           );
                if (bVar5) {
                  pDVar15 = std::
                            unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                            ::operator*(&output_db);
                  pDVar16 = std::
                            unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                            ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                         *)&replayer);
                  bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                              (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&__range1,
                                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                               *)&prune_replayer,RESOURCE_SAMPLER,
                                              (uint *)&state_json.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             );
                  if (bVar5) {
                    pDVar15 = std::
                              unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                              ::operator*(&output_db);
                    pDVar16 = std::
                              unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                              ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                           *)&replayer);
                    bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)&__range1,
                                                (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                 *)&prune_replayer.accessed_samplers._M_h.
                                                    _M_single_bucket,RESOURCE_DESCRIPTOR_SET_LAYOUT,
                                                (uint *)&state_json.
                                                                                                                  
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               );
                    if (bVar5) {
                      pDVar15 = std::
                                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ::operator*(&output_db);
                      pDVar16 = std::
                                unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                             *)&replayer);
                      bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                  (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&__range1,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&prune_replayer.accessed_pipeline_layouts._M_h.
                                                     _M_single_bucket,RESOURCE_SHADER_MODULE,
                                                  (uint *)&state_json.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 );
                      if (bVar5) {
                        pDVar15 = std::
                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  ::operator*(&output_db);
                        pDVar16 = std::
                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                               *)&replayer);
                        bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                    (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&__range1,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&prune_replayer.accessed_shader_modules._M_h.
                                                     _M_single_bucket,RESOURCE_RENDER_PASS,
                                                  (uint *)&state_json.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                        if (bVar5) {
                          pDVar15 = std::
                                    unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                    ::operator*(&output_db);
                          pDVar16 = std::
                                    unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                    ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                                 *)&replayer);
                          bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                      (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&__range1,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&prune_replayer.accessed_descriptor_sets._M_h.
                                                     _M_single_bucket,RESOURCE_PIPELINE_LAYOUT,
                                                  (uint *)&state_json.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                          if (bVar5) {
                            pDVar15 = std::
                                      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                      ::operator*(&output_db);
                            pDVar16 = std::
                                      unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                      ::operator*((
                                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                                  *)&replayer);
                            bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                        (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&__range1,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&prune_replayer.accessed_render_passes._M_h.
                                                     _M_single_bucket,RESOURCE_GRAPHICS_PIPELINE,
                                                  (uint *)&state_json.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                            if (bVar5) {
                              pDVar15 = std::
                                        unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                        ::operator*(&output_db);
                              pDVar16 = std::
                                        unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                        ::operator*((
                                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                                  *)&replayer);
                              bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                          (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&__range1,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&prune_replayer.accessed_graphics_pipelines._M_h
                                                     ._M_single_bucket,RESOURCE_COMPUTE_PIPELINE,
                                                  (uint *)&state_json.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                              if (bVar5) {
                                pDVar15 = std::
                                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                          ::operator*(&output_db);
                                pDVar16 = std::
                                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                          ::operator*((
                                                  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                                  *)&replayer);
                                bVar5 = copy_accessed_types(pDVar15,pDVar16,
                                                            (
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&__range1,
                                                  (
                                                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                                  *)&prune_replayer.accessed_compute_pipelines._M_h.
                                                     _M_single_bucket,RESOURCE_RAYTRACING_PIPELINE,
                                                  (uint *)&state_json.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                if (bVar5) {
                                  for (__end1_1 = main::playback_order;
                                      __end1_1 != (ResourceTag *)&std::piecewise_construct;
                                      __end1_1 = __end1_1 + 1) {
                                    RVar1 = *__end1_1;
                                    fprintf(_stderr,
                                            "Fossilize INFO: Pruned %s entries: %u -> %u entries\n",
                                            main::tag_names[RVar1],
                                            (ulong)per_tag_read[(ulong)RVar1 - 2],
                                            (ulong)per_tag_written[(ulong)RVar1 - 2]);
                                  }
                                }
                                else {
                                  fprintf(_stderr,
                                          "Fossilize ERROR: Failed to copy RAYTRACING_PIPELINEs.\n")
                                  ;
                                  argv_local._4_4_ = 1;
                                }
                              }
                              else {
                                fprintf(_stderr,
                                        "Fossilize ERROR: Failed to copy COMPUTE_PIPELINEs.\n");
                                argv_local._4_4_ = 1;
                              }
                            }
                            else {
                              fprintf(_stderr,
                                      "Fossilize ERROR: Failed to copy GRAPHICS_PIPELINEs.\n");
                              argv_local._4_4_ = 1;
                            }
                          }
                          else {
                            fprintf(_stderr,"Fossilize ERROR: Failed to copy PIPELINE_LAYOUTs.\n");
                            argv_local._4_4_ = 1;
                          }
                        }
                        else {
                          fprintf(_stderr,"Fossilize ERROR: Failed to copy RENDER_PASSes.\n");
                          argv_local._4_4_ = 1;
                        }
                      }
                      else {
                        fprintf(_stderr,"Fossilize ERROR: Failed to copy SHADER_MODULEs.\n");
                        argv_local._4_4_ = 1;
                      }
                    }
                    else {
                      fprintf(_stderr,"Fossilize ERROR: Failed to copy DESCRIPTOR_SET_LAYOUTs.\n");
                      argv_local._4_4_ = 1;
                    }
                  }
                  else {
                    fprintf(_stderr,"Fossilize ERROR: Failed to copy RESOURCE_SAMPLERs.\n");
                    argv_local._4_4_ = 1;
                  }
                }
                else {
                  fprintf(_stderr,"Fossilize ERROR: Failed to copy APPLICATION_BLOCK_LINK.\n");
                  argv_local._4_4_ = 1;
                }
              }
              else {
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.filtered_blob_hashes[7]._M_h._M_single_bucket);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_samplers._M_h._M_single_bucket);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_shader_modules._M_h._M_single_bucket);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_descriptor_sets._M_h._M_single_bucket);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_render_passes._M_h._M_single_bucket);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_graphics_pipelines._M_h._M_single_bucket);
                std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&prune_replayer.accessed_compute_pipelines._M_h._M_single_bucket);
                hashes_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pDVar11 = std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::operator->(&output_db);
                uVar6 = (*pDVar11->_vptr_DatabaseInterface[6])
                                  (pDVar11,4,
                                   &hashes_1.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                puVar3 = hashes_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                if ((uVar6 & 1) == 0) {
                  fprintf(_stderr,"Fossilize ERROR: Failed to get hashes.\n");
                  argv_local._4_4_ = 1;
                }
                else {
                  std::allocator<unsigned_long>::allocator
                            ((allocator<unsigned_long> *)
                             ((long)&unreferenced_modules._M_h._M_single_bucket + 7));
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f88,
                             (size_type)puVar3,
                             (allocator_type *)
                             ((long)&unreferenced_modules._M_h._M_single_bucket + 7));
                  std::allocator<unsigned_long>::~allocator
                            ((allocator<unsigned_long> *)
                             ((long)&unreferenced_modules._M_h._M_single_bucket + 7));
                  pDVar11 = std::
                            unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                            ::operator->(&output_db);
                  puVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                       local_f88);
                  uVar6 = (*pDVar11->_vptr_DatabaseInterface[6])
                                    (pDVar11,4,
                                     &hashes_1.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,puVar12);
                  if ((uVar6 & 1) == 0) {
                    fprintf(_stderr,"Fossilize ERROR: Failed to get shader module hashes.\n");
                    argv_local._4_4_ = 1;
                    bVar5 = true;
                  }
                  else {
                    std::
                    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)&__range2_1);
                    __end2_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                          local_f88);
                    h = (unsigned_long *)
                        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_f88);
                    while (bVar5 = __gnu_cxx::operator!=
                                             (&__end2_1,
                                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                               *)&h), bVar5) {
                      puVar13 = __gnu_cxx::
                                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                ::operator*(&__end2_1);
                      sVar14 = std::
                               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               ::count((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                        *)&prune_replayer.accessed_pipeline_layouts._M_h.
                                           _M_single_bucket,puVar13);
                      if (sVar14 == 0) {
                        std::
                        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                  *)&__range2_1,puVar13);
                      }
                      __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++(&__end2_1);
                    }
                    std::
                    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&prune_replayer.accessed_pipeline_layouts._M_h._M_single_bucket,
                                (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)&__range2_1);
                    std::
                    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)&__range2_1);
                    bVar5 = false;
                  }
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f88);
                  if (!bVar5) goto LAB_00106f63;
                }
              }
LAB_001074a4:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
            }
            PruneReplayer::~PruneReplayer((PruneReplayer *)local_e28);
            Fossilize::StateReplayer::~StateReplayer
                      ((StateReplayer *)&prune_replayer.has_application_info_for_blob);
            goto LAB_001074c8;
          }
        }
        fprintf(_stderr,"Fossilize ERROR: Failed to open database for writing: %s\n",
                *(undefined8 *)(cbs.default_handler._M_invoker + 0x10));
        argv_local._4_4_ = 1;
        goto LAB_001074c8;
      }
    }
    fprintf(_stderr,"Fossilize ERROR: Failed to load database: %s\n",
            *(undefined8 *)(cbs.default_handler._M_invoker + 8));
    argv_local._4_4_ = 1;
  }
LAB_001074c8:
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&replayer);
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr(&output_db);
LAB_001074e0:
  Fossilize::CLIParser::~CLIParser((CLIParser *)local_658);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)local_308);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&banned_modules._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&banned_raytracing._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&banned_compute._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&banned_graphics._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&filter_modules._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&filter_raytracing._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&filter_compute._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)(timestamp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(blacklist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(whitelist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output_db_path.field_2._M_local_buf + 8));
  Fossilize::CLICallbacks::~CLICallbacks((CLICallbacks *)((long)&input_db_path.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	CLICallbacks cbs;
	string input_db_path;
	string output_db_path;
	string whitelist, blacklist, timestamp;
	unsigned timestamp_seconds = 0;
	Hash application_hash = 0;
	bool should_filter_application_hash = false;
	bool skip_application_info_links = false;
	bool invert_module_pruning = false;

	unordered_set<Hash> filter_graphics;
	unordered_set<Hash> filter_compute;
	unordered_set<Hash> filter_raytracing;
	unordered_set<Hash> filter_modules;

	unordered_set<Hash> banned_graphics;
	unordered_set<Hash> banned_compute;
	unordered_set<Hash> banned_raytracing;
	unordered_set<Hash> banned_modules;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--filter-application", [&](CLIParser &parser) {
		application_hash = strtoull(parser.next_string(), nullptr, 16);
		should_filter_application_hash = true;
	});
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-timestamp", [&](CLIParser &parser) {
		timestamp = parser.next_string();
		timestamp_seconds = parser.next_uint();
	});
	cbs.add("--skip-graphics", [&](CLIParser &parser) {
		banned_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-compute", [&](CLIParser &parser) {
		banned_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-raytracing", [&](CLIParser &parser) {
		banned_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-module", [&](CLIParser &parser) {
		banned_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--skip-application-info-links", [&](CLIParser &) {
		skip_application_info_links = true;
	});
	cbs.add("--invert-module-pruning", [&](CLIParser &) {
		invert_module_pruning = true;
	});
	cbs.add("--whitelist", [&](CLIParser &parser) {
		whitelist = parser.next_string();
	});
	cbs.add("--blacklist", [&](CLIParser &parser) {
		blacklist = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(std::move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty() || output_db_path.empty())
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	if (input_db && !whitelist.empty())
	{
		if (!input_db->load_whitelist_database(whitelist.c_str()))
		{
			LOGE("Failed to install whitelist database %s.\n", whitelist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (input_db && !blacklist.empty())
	{
		if (!input_db->load_blacklist_database(blacklist.c_str()))
		{
			LOGE("Failed to install blacklist database %s.\n", blacklist.c_str());
			return EXIT_FAILURE;
		}
	}

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	StateReplayer replayer;
	PruneReplayer prune_replayer;

	replayer.set_resolve_shader_module_handles(false);

	if (should_filter_application_hash)
	{
		prune_replayer.should_filter_application_hash = true;
		prune_replayer.filter_application_hash = application_hash;
	}

	prune_replayer.filter_graphics = std::move(filter_graphics);
	prune_replayer.filter_compute = std::move(filter_compute);
	prune_replayer.filter_raytracing = std::move(filter_raytracing);
	prune_replayer.filter_modules = std::move(filter_modules);
	prune_replayer.banned_graphics = std::move(banned_graphics);
	prune_replayer.banned_compute = std::move(banned_compute);
	prune_replayer.banned_raytracing = std::move(banned_raytracing);
	prune_replayer.banned_modules = std::move(banned_modules);
	prune_replayer.skip_application_info_links = skip_application_info_links;

	if (!timestamp.empty())
	{
		prune_replayer.timestamp_db.reset(create_stream_archive_database(timestamp.c_str(), DatabaseMode::ReadOnly));
		if (!prune_replayer.timestamp_db->prepare())
		{
			LOGE("Failed to open timestamp DB.\n");
			return EXIT_FAILURE;
		}
		prune_replayer.timestamp_minimum_accept = time(nullptr);
		prune_replayer.timestamp_minimum_accept -=
				std::min<uint64_t>(prune_replayer.timestamp_minimum_accept, timestamp_seconds);
	}

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO,
		RESOURCE_APPLICATION_BLOB_LINK,
		RESOURCE_SHADER_MODULE,
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in dependent samplers.
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	unsigned per_tag_read[RESOURCE_COUNT] = {};
	unsigned per_tag_written[RESOURCE_COUNT] = {};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Application Blob Link",
		"Raytracing Pipeline",
	};

	vector<uint8_t> state_json;

	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		per_tag_read[tag] = hash_count;

		// No need to resolve this type.
		if (tag == RESOURCE_SHADER_MODULE)
			continue;

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		// Filter application infos as well,
		// but avoid a situation where we omit all application infos since these are very important in replay.
		if (tag == RESOURCE_APPLICATION_INFO && prune_replayer.timestamp_db)
		{
			vector<Hash> accepted_hashes;
			uint64_t latest_ts = 0;
			Hash latest_hash = 0;

			for (auto hash : hashes)
			{
				uint64_t ts = 0;
				if (hash == application_hash || prune_replayer.filter_timestamp(RESOURCE_APPLICATION_INFO, hash, &ts))
					accepted_hashes.push_back(hash);

				if (ts > latest_ts)
				{
					latest_hash = hash;
					latest_ts = ts;
				}
			}

			if (accepted_hashes.empty())
				accepted_hashes.push_back(latest_hash);

			hashes = std::move(accepted_hashes);
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			prune_replayer.has_application_info_for_blob = false;
			prune_replayer.blob_belongs_to_application_info = false;
			if (!replayer.parse(prune_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);

			if (tag == RESOURCE_APPLICATION_INFO)
			{
				if (!should_filter_application_hash || hash == application_hash)
				{
					size_t compressed_size = 0;
					if (!input_db->read_entry(tag, hash, &compressed_size, nullptr, PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					state_json.resize(compressed_size);
					if (!input_db->read_entry(tag, hash, &compressed_size, state_json.data(),
					                          PAYLOAD_READ_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					if (!output_db->write_entry(tag, hash, state_json.data(), state_json.size(),
					                            PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT))
						return EXIT_FAILURE;
					per_tag_written[tag]++;
				}
			}
		}

		if (tag == RESOURCE_GRAPHICS_PIPELINE)
			prune_replayer.access_graphics_pipelines();
		else if (tag == RESOURCE_RAYTRACING_PIPELINE)
			prune_replayer.access_raytracing_pipelines();
	}

	if (invert_module_pruning)
	{
		// In this mode we're only interesting in emitting the shader modules we did not emit for whatever reason.
		// A handy debug option in some scenarios.
		prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK].clear();
		prune_replayer.accessed_samplers.clear();
		prune_replayer.accessed_descriptor_sets.clear();
		prune_replayer.accessed_render_passes.clear();
		prune_replayer.accessed_pipeline_layouts.clear();
		prune_replayer.accessed_graphics_pipelines.clear();
		prune_replayer.accessed_compute_pipelines.clear();
		prune_replayer.accessed_raytracing_pipelines.clear();

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(RESOURCE_SHADER_MODULE, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		unordered_set<Hash> unreferenced_modules;
		for (auto &h : hashes)
			if (prune_replayer.accessed_shader_modules.count(h) == 0)
				unreferenced_modules.insert(h);
		prune_replayer.accessed_shader_modules = std::move(unreferenced_modules);
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.filtered_blob_hashes[RESOURCE_APPLICATION_BLOB_LINK],
	                         RESOURCE_APPLICATION_BLOB_LINK,
	                         per_tag_written))
	{
		LOGE("Failed to copy APPLICATION_BLOCK_LINK.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_samplers, RESOURCE_SAMPLER,
	                         per_tag_written))
	{
		LOGE("Failed to copy RESOURCE_SAMPLERs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_descriptor_sets, RESOURCE_DESCRIPTOR_SET_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy DESCRIPTOR_SET_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_shader_modules, RESOURCE_SHADER_MODULE,
	                         per_tag_written))
	{
		LOGE("Failed to copy SHADER_MODULEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_render_passes, RESOURCE_RENDER_PASS,
	                         per_tag_written))
	{
		LOGE("Failed to copy RENDER_PASSes.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_pipeline_layouts, RESOURCE_PIPELINE_LAYOUT,
	                         per_tag_written))
	{
		LOGE("Failed to copy PIPELINE_LAYOUTs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_graphics_pipelines, RESOURCE_GRAPHICS_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy GRAPHICS_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
	                         prune_replayer.accessed_compute_pipelines, RESOURCE_COMPUTE_PIPELINE,
	                         per_tag_written))
	{
		LOGE("Failed to copy COMPUTE_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	if (!copy_accessed_types(*input_db, *output_db, state_json,
							 prune_replayer.accessed_raytracing_pipelines, RESOURCE_RAYTRACING_PIPELINE,
							 per_tag_written))
	{
		LOGE("Failed to copy RAYTRACING_PIPELINEs.\n");
		return EXIT_FAILURE;
	}

	for (auto tag : playback_order)
		LOGI("Pruned %s entries: %u -> %u entries\n", tag_names[tag], per_tag_read[tag], per_tag_written[tag]);
}